

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

void __thiscall llvm::detail::IEEEFloat::initFromDoubleAPInt(IEEEFloat *this,APInt *api)

{
  ulong uVar1;
  uint uVar2;
  uint64_t *puVar3;
  ulong uVar4;
  ulong uVar5;
  integerPart *piVar6;
  uint64_t mysignificand;
  uint64_t myexponent;
  uint64_t i;
  APInt *api_local;
  IEEEFloat *this_local;
  
  uVar2 = APInt::getBitWidth(api);
  if (uVar2 != 0x40) {
    __assert_fail("api.getBitWidth()==64",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xc41,"void llvm::detail::IEEEFloat::initFromDoubleAPInt(const APInt &)");
  }
  puVar3 = APInt::getRawData(api);
  uVar1 = *puVar3;
  uVar4 = uVar1 >> 0x34 & 0x7ff;
  uVar5 = uVar1 & 0xfffffffffffff;
  initialize(this,(fltSemantics *)semIEEEdouble);
  uVar2 = partCount(this);
  if (uVar2 != 1) {
    __assert_fail("partCount()==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xc47,"void llvm::detail::IEEEFloat::initFromDoubleAPInt(const APInt &)");
  }
  this->field_0x12 = this->field_0x12 & 0xf7 | (byte)(uVar1 >> 0x3f) << 3;
  if ((uVar4 == 0) && (uVar5 == 0)) {
    this->field_0x12 = this->field_0x12 & 0xf8 | 3;
  }
  else if ((uVar4 == 0x7ff) && (uVar5 == 0)) {
    this->field_0x12 = this->field_0x12 & 0xf8;
  }
  else if ((uVar4 == 0x7ff) && (uVar5 != 0)) {
    this->field_0x12 = this->field_0x12 & 0xf8 | 1;
    piVar6 = significandParts(this);
    *piVar6 = uVar5;
  }
  else {
    this->field_0x12 = this->field_0x12 & 0xf8 | 2;
    this->exponent = (short)uVar4 + -0x3ff;
    piVar6 = significandParts(this);
    *piVar6 = uVar5;
    if (uVar4 == 0) {
      this->exponent = -0x3fe;
    }
    else {
      piVar6 = significandParts(this);
      *piVar6 = *piVar6 | 0x10000000000000;
    }
  }
  return;
}

Assistant:

void IEEEFloat::initFromDoubleAPInt(const APInt &api) {
  assert(api.getBitWidth()==64);
  uint64_t i = *api.getRawData();
  uint64_t myexponent = (i >> 52) & 0x7ff;
  uint64_t mysignificand = i & 0xfffffffffffffLL;

  initialize(&semIEEEdouble);
  assert(partCount()==1);

  sign = static_cast<unsigned int>(i>>63);
  if (myexponent==0 && mysignificand==0) {
    // exponent, significand meaningless
    category = fcZero;
  } else if (myexponent==0x7ff && mysignificand==0) {
    // exponent, significand meaningless
    category = fcInfinity;
  } else if (myexponent==0x7ff && mysignificand!=0) {
    // exponent meaningless
    category = fcNaN;
    *significandParts() = mysignificand;
  } else {
    category = fcNormal;
    exponent = myexponent - 1023;
    *significandParts() = mysignificand;
    if (myexponent==0)          // denormal
      exponent = -1022;
    else
      *significandParts() |= 0x10000000000000LL;  // integer bit
  }
}